

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O1

ostream * toml::operator<<(ostream *os,time_offset *offset)

{
  ostream oVar1;
  ostream *poVar2;
  uint uVar3;
  char local_1c [4];
  
  if (offset->hour == '\0' && offset->minute == '\0') {
    local_1c[0] = 'Z';
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1c,1);
  }
  else {
    uVar3 = offset->hour * 0x3c + (int)offset->minute;
    if ((int)uVar3 < 0) {
      local_1c[1] = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 1,1);
      uVar3 = -uVar3;
    }
    else {
      local_1c[2] = 0x2b;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 2,1);
    }
    poVar2 = os + *(long *)(*(long *)os + -0x18);
    if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar2);
      poVar2[0xe0] = oVar1;
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
    poVar2 = (ostream *)std::ostream::operator<<(os,uVar3 / 0x3c);
    local_1c[3] = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1c + 3,1);
    poVar2 = os + *(long *)(*(long *)os + -0x18);
    if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
      oVar1 = (ostream)std::ios::widen((char)poVar2);
      poVar2[0xe0] = oVar1;
      poVar2[0xe1] = (ostream)0x1;
    }
    poVar2[0xe0] = (ostream)0x30;
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
    std::ostream::operator<<(os,uVar3 % 0x3c);
  }
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const time_offset& offset)
{
    if(offset.hour == 0 && offset.minute == 0)
    {
        os << 'Z';
        return os;
    }
    int minute = static_cast<int>(offset.hour) * 60 + offset.minute;
    if(minute < 0){os << '-'; minute = std::abs(minute);} else {os << '+';}
    os << std::setfill('0') << std::setw(2) << minute / 60 << ':';
    os << std::setfill('0') << std::setw(2) << minute % 60;
    return os;
}